

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O0

void glu::sl::dumpValues(TestLog *log,
                        vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *values,
                        char *storageName,int arrayNdx)

{
  size_type sVar1;
  const_reference val;
  undefined8 local_30;
  size_t valNdx;
  int arrayNdx_local;
  char *storageName_local;
  vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *values_local;
  TestLog *log_local;
  
  local_30 = 0;
  while( true ) {
    sVar1 = std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::size(values);
    if (sVar1 <= local_30) break;
    val = std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::operator[](values,local_30);
    dumpValue(log,val,storageName,arrayNdx);
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

static void dumpValues (tcu::TestLog& log, const vector<Value>& values, const char* storageName, int arrayNdx)
{
	for (size_t valNdx = 0; valNdx < values.size(); valNdx++)
		dumpValue(log, values[valNdx], storageName, arrayNdx);
}